

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Face.cpp
# Opt level: O2

void __thiscall
Nova::Grid_Iterator_Face<float,_1>::Reset_Axis(Grid_Iterator_Face<float,_1> *this,int axis_input)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int i;
  uint uVar4;
  Range<int,_1> *region_input;
  char *__assertion;
  uint uVar5;
  int iVar6;
  Range<int,_1> domain_copy;
  Range<int,_1> domain;
  
  this->axis = axis_input;
  (this->super_Grid_Iterator<float,_1>).number_of_regions = 0;
  uVar4 = 1;
  domain.min_corner._data._M_elems[0] = (T_STORAGE)(1 - this->number_of_ghost_cells);
  domain.max_corner._data._M_elems[0] =
       (T_STORAGE)
       (this->number_of_ghost_cells +
       (((this->super_Grid_Iterator<float,_1>).grid)->counts)._data._M_elems[0]);
  if (this->region_type < Boundary_Interior_Region) {
    switch(this->region_type) {
    case Whole_Region:
      if (this->side != 0) {
        __assertion = "!side";
        uVar4 = 0x31;
        goto LAB_0012a380;
      }
      piVar3 = Vector<int,_1,_true>::operator()(&domain.max_corner,axis_input);
      *piVar3 = *piVar3 + 1;
      region_input = &domain;
      break;
    case Ghost_Region:
      uVar5 = this->side;
      if (uVar5 == 0) {
        for (; uVar4 != 3; uVar4 = uVar4 + 1) {
          if ((uVar4 & 1) == 0) {
            domain_copy.max_corner = (TV)(TV)domain.max_corner._data._M_elems[0];
            domain_copy.min_corner = (TV)(TV)domain.min_corner._data._M_elems[0];
            piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,this->axis);
            *piVar3 = *piVar3 + 1;
            domain_copy.min_corner._data._M_elems[0] =
                 (T_STORAGE)
                 (T_STORAGE)
                 (((int)domain_copy.max_corner._data._M_elems[0] - this->number_of_ghost_cells) + 1)
            ;
          }
          else {
            domain_copy.max_corner = (TV)(TV)domain.max_corner._data._M_elems[0];
            domain_copy.min_corner = (TV)(TV)domain.min_corner._data._M_elems[0];
            piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,this->axis);
            *piVar3 = *piVar3 + 1;
            domain_copy.max_corner._data._M_elems[0] =
                 (T_STORAGE)
                 (T_STORAGE)
                 ((int)domain_copy.min_corner._data._M_elems[0] + this->number_of_ghost_cells + -1);
          }
          Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy);
        }
        goto LAB_0012a1f4;
      }
      iVar6 = (int)(uVar5 + 1) / 2;
      if ((uVar5 & 1) != 0) {
        domain_copy.max_corner._data._M_elems[0] = (T_STORAGE)(T_STORAGE)domain.max_corner;
        domain_copy.min_corner._data._M_elems[0] = (T_STORAGE)(T_STORAGE)domain.min_corner;
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,axis_input);
        *piVar3 = *piVar3 + 1;
        i = iVar6 + -1;
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.min_corner,i);
        iVar1 = *piVar3;
        iVar2 = this->number_of_ghost_cells;
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,i);
        *piVar3 = iVar1 + iVar2 + -1;
        Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy);
        uVar5 = this->side;
      }
      if ((uVar5 & 1) != 0) goto LAB_0012a1f4;
      domain_copy.max_corner = (TV)(TV)domain.max_corner._data._M_elems[0];
      domain_copy.min_corner = (TV)(TV)domain.min_corner._data._M_elems[0];
      piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,this->axis);
      *piVar3 = *piVar3 + 1;
      iVar6 = iVar6 + -1;
      piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,iVar6);
      iVar1 = *piVar3;
      iVar2 = this->number_of_ghost_cells;
      region_input = &domain_copy;
      piVar3 = Vector<int,_1,_true>::operator()(&region_input->min_corner,iVar6);
      *piVar3 = (iVar1 - iVar2) + 1;
      break;
    case Boundary_Region:
      uVar4 = this->side;
      if (uVar4 == 0 || (uVar4 & 1) != 0) {
        domain_copy.max_corner._data._M_elems[0] = (T_STORAGE)(T_STORAGE)domain.max_corner;
        domain_copy.min_corner._data._M_elems[0] = (T_STORAGE)(T_STORAGE)domain.min_corner;
        piVar3 = Vector<int,_1,_true>::operator()(&domain.min_corner,axis_input);
        iVar6 = *piVar3;
        piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,this->axis);
        *piVar3 = iVar6;
        Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy);
        uVar4 = this->side;
      }
      if ((uVar4 & 1) != 0) goto LAB_0012a1f4;
      domain_copy.max_corner = (TV)(TV)domain.max_corner._data._M_elems[0];
      domain_copy.min_corner = (TV)(TV)domain.min_corner._data._M_elems[0];
      piVar3 = Vector<int,_1,_true>::operator()(&domain.max_corner,this->axis);
      iVar6 = *piVar3;
      piVar3 = Vector<int,_1,_true>::operator()(&domain_copy.max_corner,this->axis);
      *piVar3 = iVar6 + 1;
      region_input = &domain_copy;
      piVar3 = Vector<int,_1,_true>::operator()(&region_input->min_corner,this->axis);
      *piVar3 = iVar6 + 1;
      break;
    case Interior_Region:
      if (this->side != 0) goto LAB_0012a350;
      region_input = &domain;
      piVar3 = Vector<int,_1,_true>::operator()(&region_input->min_corner,axis_input);
      *piVar3 = *piVar3 + 1;
    }
    Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,region_input);
LAB_0012a1f4:
    Grid_Iterator<float,_1>::Reset(&this->super_Grid_Iterator<float,_1>,0);
    return;
  }
LAB_0012a350:
  __assertion = "(region_type==Grid<T,d>::Interior_Region) && !side";
  uVar4 = 99;
LAB_0012a380:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Face.cpp"
                ,uVar4,
                "void Nova::Grid_Iterator_Face<float, 1>::Reset_Axis(const int) [T = float, d = 1]")
  ;
}

Assistant:

void Grid_Iterator_Face<T,d>::
Reset_Axis(const int axis_input)
{
    axis=axis_input;
    Reset_Regions();
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:       assert(!side);
                                            ++domain.max_corner(axis);
                                            Add_Region(domain);
                                            break;

        case Grid<T,d>::Ghost_Region:       if(!side)
                                            {
                                                for(int side_iterator=1;side_iterator<=2*d;++side_iterator){
                                                    int axis_of_side=(side_iterator+1)/2;
                                                    if(side_iterator&1){
                                                        Range<int,d> domain_copy(domain);
                                                        ++domain_copy.max_corner(axis);
                                                        domain_copy.max_corner(axis_of_side-1)=domain_copy.min_corner(axis_of_side-1)+number_of_ghost_cells-1;
                                                        Add_Region(domain_copy);}
                                                    if(!(side_iterator&1)){
                                                        Range<int,d> domain_copy(domain);
                                                        ++domain_copy.max_corner(axis);
                                                        domain_copy.min_corner(axis_of_side-1)=domain_copy.max_corner(axis_of_side-1)-number_of_ghost_cells+1;
                                                        Add_Region(domain_copy);}}
                                            }
                                            else
                                            {
                                                int axis_of_side=(side+1)/2;
                                                if(side&1){
                                                    Range<int,d> domain_copy(domain);
                                                    ++domain_copy.max_corner(axis);
                                                    domain_copy.max_corner(axis_of_side-1)=domain_copy.min_corner(axis_of_side-1)+number_of_ghost_cells-1;
                                                    Add_Region(domain_copy);}
                                                if(!(side&1)){
                                                    Range<int,d> domain_copy(domain);
                                                    ++domain_copy.max_corner(axis);
                                                    domain_copy.min_corner(axis_of_side-1)=domain_copy.max_corner(axis_of_side-1)-number_of_ghost_cells+1;
                                                    Add_Region(domain_copy);}
                                            }
                                            break;

        case Grid<T,d>::Boundary_Region:    if(!side || side&1)
                                            {
                                                Range<int,d> domain_copy(domain);
                                                domain_copy.max_corner(axis)=domain.min_corner(axis);
                                                Add_Region(domain_copy);
                                            }
                                            if(!side || !(side&1))
                                            {
                                                Range<int,d> domain_copy(domain);
                                                domain_copy.min_corner(axis)=domain_copy.max_corner(axis)=domain.max_corner(axis)+1;
                                                Add_Region(domain_copy);
                                            }
                                            break;

        default:                            assert((region_type==Grid<T,d>::Interior_Region) && !side);
                                            ++domain.min_corner(axis);
                                            Add_Region(domain);
                                            break;
    }
    Reset();
}